

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O0

void __thiscall gl4cts::GetTextureSubImage::Tests::Tests(Tests *this,Context *context)

{
  Errors *this_00;
  Functional *this_01;
  Context *context_local;
  Tests *this_local;
  
  deqp::TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,"get_texture_sub_image",
             "Get Texture Sub Image Tests Suite");
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Tests_03231b28;
  this_00 = (Errors *)operator_new(0xb0);
  Errors::Errors(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (Functional *)operator_new(0x98);
  GetTextureSubImage::Functional::Functional(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return;
}

Assistant:

gl4cts::GetTextureSubImage::Tests::Tests(deqp::Context& context)
	: TestCaseGroup(context, "get_texture_sub_image", "Get Texture Sub Image Tests Suite")
{
	addChild(new GetTextureSubImage::Errors(m_context));
	addChild(new GetTextureSubImage::Functional(m_context));
}